

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

void __thiscall
capnp::compiler::ModuleLoader::ModuleLoader(ModuleLoader *this,GlobalErrorReporter *errorReporter)

{
  GlobalErrorReporter *errorReporter_local;
  ModuleLoader *this_local;
  
  kj::heap<capnp::compiler::ModuleLoader::Impl,capnp::compiler::GlobalErrorReporter&>
            ((kj *)this,errorReporter);
  return;
}

Assistant:

ModuleLoader::ModuleLoader(GlobalErrorReporter& errorReporter)
    : impl(kj::heap<Impl>(errorReporter)) {}